

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::goOpen(Restaurant *this,string *details)

{
  int ind;
  Table *pTVar1;
  ulong uVar2;
  reference ppTVar3;
  Customer *pCVar4;
  OpenTable *this_00;
  bool bVar5;
  OpenTable *local_1a0;
  OpenTable *local_198;
  OpenTable *open;
  string local_170 [32];
  Customer *local_150;
  Customer *newCustomer;
  string local_128 [32];
  long local_108;
  size_t pos2;
  string local_e0 [8];
  string token2;
  string local_c0 [8];
  string token1;
  size_t pos1;
  string local_90 [8];
  string delimiterComa;
  allocator local_59;
  string local_58 [8];
  string delimiterSpace;
  undefined1 local_30 [4];
  int tableId;
  vector<Customer_*,_std::allocator<Customer_*>_> customers;
  string *details_local;
  Restaurant *this_local;
  
  customers.super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)details;
  std::__cxx11::string::operator=((string *)&this->newMsg,(string *)details);
  std::vector<Customer_*,_std::allocator<Customer_*>_>::vector
            ((vector<Customer_*,_std::allocator<Customer_*>_> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58," ",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,",",(allocator *)((long)&pos1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos1 + 7));
  std::__cxx11::string::string(local_c0);
  std::__cxx11::string::string(local_e0);
  std::__cxx11::string::find((string *)details,(ulong)local_58);
  std::__cxx11::string::substr((ulong)&pos2,(ulong)details);
  std::__cxx11::string::operator=(local_c0,(string *)&pos2);
  std::__cxx11::string::~string((string *)&pos2);
  ind = std::__cxx11::stoi((string *)local_c0,(size_t *)0x0,10);
  std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)details,0);
  local_108 = 0;
  while( true ) {
    local_108 = std::__cxx11::string::find((string *)details,(ulong)local_58);
    bVar5 = false;
    if (local_108 != -1) {
      pTVar1 = getTable(this,ind);
      bVar5 = pTVar1 != (Table *)0x0;
    }
    if (!bVar5) break;
    local_108 = std::__cxx11::string::find((string *)details,(ulong)local_90);
    std::__cxx11::string::substr((ulong)local_128,(ulong)details);
    std::__cxx11::string::operator=(local_c0,local_128);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)details,0);
    local_108 = std::__cxx11::string::find((string *)details,(ulong)local_58);
    std::__cxx11::string::substr((ulong)&newCustomer,(ulong)details);
    std::__cxx11::string::operator=(local_e0,(string *)&newCustomer);
    std::__cxx11::string::~string((string *)&newCustomer);
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)details,0);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      ppTVar3 = std::vector<Table_*,_std::allocator<Table_*>_>::at(&this->tables,(long)ind);
      bVar5 = Table::isOpen(*ppTVar3);
      if (!bVar5) {
        std::__cxx11::string::string(local_170,local_c0);
        std::__cxx11::string::string((string *)&open,local_e0);
        pCVar4 = createCustomerByType(this,(string *)local_170,(string *)&open);
        std::__cxx11::string::~string((string *)&open);
        std::__cxx11::string::~string(local_170);
        local_150 = pCVar4;
        std::vector<Customer_*,_std::allocator<Customer_*>_>::push_back
                  ((vector<Customer_*,_std::allocator<Customer_*>_> *)local_30,&local_150);
        this->nextCustomerId = this->nextCustomerId + 1;
        std::__cxx11::string::operator=(local_c0,"");
        std::__cxx11::string::operator=(local_e0,"");
      }
    }
  }
  this_00 = (OpenTable *)operator_new(0x68);
  OpenTable::OpenTable
            (this_00,(long)ind,(vector<Customer_*,_std::allocator<Customer_*>_> *)local_30);
  local_198 = this_00;
  (**(this_00->super_BaseAction)._vptr_BaseAction)(this_00,this);
  local_1a0 = local_198;
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::push_back
            (&this->actionsLog,(value_type *)&local_1a0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  std::vector<Customer_*,_std::allocator<Customer_*>_>::~vector
            ((vector<Customer_*,_std::allocator<Customer_*>_> *)local_30);
  return;
}

Assistant:

void Restaurant::goOpen(std::string details)
{
    newMsg = details;
    std::vector<Customer*> customers;
    int tableId;
    std::string delimiterSpace = " ";
    std::string delimiterComa = ",";
    size_t pos1 = 0;
    std::string token1;
    std::string token2;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId = std::stoi(token1);//get the id
    details.erase(0, pos1 + delimiterSpace.length());

    //get the customers
    size_t pos2 = 0;
    while((pos2 = details.find(delimiterSpace)) != std::string::npos && getTable(tableId) != nullptr)
    {
        pos2 = details.find(delimiterComa);
        token1 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterComa.length());
        pos2 = details.find(delimiterSpace);
        token2 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterSpace.length());
        if(!token1.empty() && !token2.empty() && !tables.at(static_cast<unsigned long>(tableId))->isOpen())
        {
            Customer *newCustomer = createCustomerByType(token1, token2);
            customers.push_back(newCustomer);
            nextCustomerId++;
            token1="";
            token2="";
        }
    }
    auto open = new OpenTable(static_cast<unsigned long>(tableId), customers);
    open->act(*this);
    actionsLog.push_back(open);
}